

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,TagSymbol *name)

{
  const_iterator cVar1;
  GlobalName local_28;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->import_module_sym_map_)._M_t,(name->super_GlobalName).name);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->import_module_sym_map_)._M_t._M_impl.super__Rb_tree_header) {
    WriteData(this,"&",1);
  }
  local_28.type = (name->super_GlobalName).type;
  local_28._4_4_ = *(undefined4 *)&(name->super_GlobalName).field_0x4;
  local_28.name = (name->super_GlobalName).name;
  Write(this,&local_28);
  return;
}

Assistant:

void CWriter::Write(const TagSymbol& name) {
  if (!IsImport(name.name)) {
    Write("&");
  }
  Write(GlobalName(name));
}